

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::builtins::SdfAnnotateTask::bindArgument
          (SdfAnnotateTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *comp;
  bool bVar1;
  InvalidExpression *pIVar2;
  Expression *pEVar3;
  SourceRange sourceRange;
  InvalidExpression *local_20;
  
  if (argIndex == 1) {
    comp = ((context->scope).ptr)->compilation;
    bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (bVar1) {
      pIVar2 = (InvalidExpression *)
               ArbitrarySymbolExpression::fromSyntax
                         (comp,(NameSyntax *)syntax,context,(bitmask<slang::ast::LookupFlags>)0x0);
      if (((pIVar2->super_Expression).kind == ArbitrarySymbol) &&
         (((((InstanceSymbol *)pIVar2->child)->super_InstanceSymbolBase).super_Symbol.kind !=
           Instance || (bVar1 = InstanceSymbol::isModule((InstanceSymbol *)pIVar2->child), !bVar1)))
         ) {
        bVar1 = Scope::isUninstantiated((context->scope).ptr);
        if (!bVar1) {
          ASTContext::addDiag(context,(DiagCode)0xa000b,(pIVar2->super_Expression).sourceRange);
        }
        local_20 = pIVar2;
        pIVar2 = BumpAllocator::
                 emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                           (&comp->super_BumpAllocator,(Expression **)&local_20,comp->errorType);
      }
    }
    else {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0xa000b,sourceRange);
      local_20 = (InvalidExpression *)0x0;
      pIVar2 = BumpAllocator::
               emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                         (&comp->super_BumpAllocator,&local_20,comp->errorType);
    }
    return &pIVar2->super_Expression;
  }
  pEVar3 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
  return pEVar3;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 1) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleInstance, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule()) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModuleInstance, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }